

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::
StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
::WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  undefined1 uVar1;
  Vector *col;
  unsigned_long *puVar2;
  idx_t i;
  Allocator *pAVar3;
  long lVar4;
  idx_t iVar5;
  primitive_dictionary_entry_t *ppVar6;
  InternalException *this_00;
  uint *puVar7;
  _func_int **extraout_RDX;
  _func_int **extraout_RDX_00;
  _func_int **pp_Var8;
  _func_int **extraout_RDX_01;
  _func_int **extraout_RDX_02;
  _func_int **extraout_RDX_03;
  _func_int **extraout_RDX_04;
  ValidityMask *mask;
  WriteStream *ser;
  hugeint_t *value;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  idx_t r;
  idx_t iVar10;
  ParquetUUIDTargetType target_value;
  ParquetUUIDTargetType target_value_00;
  ParquetUUIDTargetType target_value_01;
  ParquetUUIDTargetType target_value_02;
  ParquetUUIDTargetType target_value_03;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  string local_60;
  StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
  *local_40;
  DlbaEncoder *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_40 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_01bcd697_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Unknown encoding","");
    InternalException::InternalException(this_00,&local_60);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  col = (Vector *)input_column->data;
  mask = &input_column->validity;
  puVar7 = &switchD_01bcd697::switchdataD_01e2f7e8;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,true>
                (col,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,false>
              (col,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_01bcd697_caseD_1;
  case 5:
    pp_Var8 = extraout_RDX;
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar10 = chunk_start;
      do {
        iVar5 = chunk_start;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (pp_Var8 = (_func_int **)puVar2[iVar10 >> 6], iVar5 = iVar10,
           ((ulong)pp_Var8 >> (iVar10 & 0x3f) & 1) != 0)) {
          input_02.upper = (int64_t)pp_Var8;
          input_02.lower = *(uint64_t *)(&(col->type).id_ + iVar5 * 0x10);
          local_60._0_16_ =
               ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                         (*(ParquetUUIDOperator **)(&col->vector_type + iVar5 * 0x10),input_02);
          target_value_02.bytes._0_8_ = local_60._M_string_length;
          puVar7 = (uint *)&local_60;
          target_value_02.bytes._8_8_ = puVar7;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)stats,local_60._M_dataplus._M_p,target_value_02);
          DbpEncoder::BeginWrite<duckdb::ParquetUUIDTargetType>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(ParquetUUIDTargetType *)&local_60
                    );
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar5 + 1;
          pp_Var8 = extraout_RDX_03;
          goto LAB_01bcda74;
        }
        iVar10 = iVar10 + 1;
      } while (chunk_end != iVar10);
    }
    else {
LAB_01bcda74:
      if (chunk_start < chunk_end) {
        p_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (&(col->type).id_ + chunk_start * 0x10);
        do {
          puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) ||
             (puVar7 = (uint *)(chunk_start >> 6),
             (puVar2[(long)puVar7] >> (chunk_start & 0x3f) & 1) != 0)) {
            input_03.upper = (int64_t)pp_Var8;
            input_03.lower = (uint64_t)p_Var9->_M_pi;
            local_60._0_16_ =
                 ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                           ((ParquetUUIDOperator *)
                            ((__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)
                            (p_Var9 + -1))->_M_ptr,input_03);
            target_value_03.bytes._0_8_ = local_60._M_string_length;
            target_value_03.bytes._8_8_ = puVar7;
            ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                      ((ParquetUUIDOperator *)stats,local_60._M_dataplus._M_p,target_value_03);
            DbpEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,
                       (ParquetUUIDTargetType *)&local_60);
            pp_Var8 = extraout_RDX_04;
          }
          chunk_start = chunk_start + 1;
          p_Var9 = p_Var9 + 2;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 6:
    pp_Var8 = extraout_RDX;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar10 = chunk_start;
      do {
        iVar5 = chunk_start;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (pp_Var8 = (_func_int **)puVar2[iVar10 >> 6], iVar5 = iVar10,
           ((ulong)pp_Var8 >> (iVar10 & 0x3f) & 1) != 0)) {
          input_00.upper = (int64_t)pp_Var8;
          input_00.lower = *(uint64_t *)(&(col->type).id_ + iVar5 * 0x10);
          local_60._0_16_ =
               ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                         (*(ParquetUUIDOperator **)(&col->vector_type + iVar5 * 0x10),input_00);
          target_value_00.bytes._0_8_ = local_60._M_string_length;
          target_value_00.bytes._8_8_ = &local_60;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)stats,local_60._M_dataplus._M_p,target_value_00);
          local_38 = (DlbaEncoder *)(page_state_p + 0x909);
          pAVar3 = BufferAllocator::Get
                             (((local_40->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          puVar7 = (uint *)&local_60;
          DlbaEncoder::BeginWrite<duckdb::ParquetUUIDTargetType>
                    (local_38,pAVar3,temp_writer,(ParquetUUIDTargetType *)puVar7);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar5 + 1;
          pp_Var8 = extraout_RDX_01;
          goto LAB_01bcd905;
        }
        iVar10 = iVar10 + 1;
      } while (chunk_end != iVar10);
    }
    else {
LAB_01bcd905:
      if (chunk_start < chunk_end) {
        p_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (&(col->type).id_ + chunk_start * 0x10);
        do {
          puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) ||
             (puVar7 = (uint *)(chunk_start >> 6),
             (puVar2[(long)puVar7] >> (chunk_start & 0x3f) & 1) != 0)) {
            input_01.upper = (int64_t)pp_Var8;
            input_01.lower = (uint64_t)p_Var9->_M_pi;
            local_60._0_16_ =
                 ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                           ((ParquetUUIDOperator *)
                            ((__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)
                            (p_Var9 + -1))->_M_ptr,input_01);
            target_value_01.bytes._0_8_ = local_60._M_string_length;
            target_value_01.bytes._8_8_ = puVar7;
            ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                      ((ParquetUUIDOperator *)stats,local_60._M_dataplus._M_p,target_value_01);
            DlbaEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                      ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,
                       (ParquetUUIDTargetType *)&local_60);
            pp_Var8 = extraout_RDX_02;
          }
          chunk_start = chunk_start + 1;
          p_Var9 = p_Var9 + 2;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 8:
    iVar10 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar5 = chunk_start;
      do {
        iVar10 = chunk_start;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (iVar10 = iVar5, (puVar2[iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
          local_60._M_dataplus._M_p._0_1_ =
               *(data_t *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_60,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_01bcd9bb;
        }
        iVar5 = iVar5 + 1;
      } while (chunk_end != iVar5);
    }
    else {
LAB_01bcd9bb:
      if (iVar10 < chunk_end) {
        value = (hugeint_t *)(&col->vector_type + iVar10 * 0x10);
        do {
          puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) ||
             ((puVar2[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0)) {
            ppVar6 = PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
                     ::Lookup((PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
                               *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
            local_60._M_dataplus._M_p._0_4_ = ppVar6->index;
            RleBpEncoder::WriteValue
                      ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_60);
          }
          iVar10 = iVar10 + 1;
          value = value + 1;
        } while (chunk_end != iVar10);
      }
    }
    break;
  case 9:
    pp_Var8 = extraout_RDX;
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar3 = BufferAllocator::Get
                         (((local_40->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar3);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
      pp_Var8 = extraout_RDX_00;
    }
    if (chunk_start < chunk_end) {
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (puVar7 = (uint *)(chunk_start >> 6),
           (puVar2[(long)puVar7] >> (chunk_start & 0x3f) & 1) != 0)) {
          input.upper = (int64_t)pp_Var8;
          input.lower = *(uint64_t *)(&(col->type).id_ + chunk_start * 0x10);
          local_60._0_16_ =
               ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                         (*(ParquetUUIDOperator **)(&col->vector_type + chunk_start * 0x10),input);
          target_value.bytes._0_8_ = local_60._M_string_length;
          target_value.bytes._8_8_ = puVar7;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)stats,local_60._M_dataplus._M_p,target_value);
          lVar4 = 0;
          do {
            uVar1 = *(undefined1 *)((long)&local_60._M_dataplus._M_p + lVar4);
            puVar7 = (uint *)CONCAT71((int7)((ulong)puVar7 >> 8),uVar1);
            pp_Var8 = (_func_int **)
                      ((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar4 +
                      (long)page_state_p[0x1219]._vptr_ColumnWriterPageState);
            *(undefined1 *)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + (long)pp_Var8)
                 = uVar1;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x10);
          page_state_p[0x1217]._vptr_ColumnWriterPageState =
               (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        }
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}